

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::InterCallTestCase::deinit(InterCallTestCase *this)

{
  ShaderProgram *this_00;
  int iVar1;
  pointer ppSVar2;
  undefined4 extraout_var;
  pointer puVar3;
  undefined4 extraout_var_00;
  _Rb_tree_node_base *p_Var4;
  pointer ppSVar5;
  pointer puVar6;
  long lVar7;
  long lVar8;
  
  ppSVar2 = (this->m_operationPrograms).
            super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppSVar5 = (this->m_operationPrograms).
            super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppSVar5 - (long)ppSVar2) >> 3)) {
    lVar7 = 0;
    do {
      this_00 = ppSVar2[lVar7];
      if (this_00 != (ShaderProgram *)0x0) {
        glu::ShaderProgram::~ShaderProgram(this_00);
        operator_delete(this_00,0xd0);
      }
      lVar7 = lVar7 + 1;
      ppSVar2 = (this->m_operationPrograms).
                super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppSVar5 = (this->m_operationPrograms).
                super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    } while (lVar7 < (int)((ulong)((long)ppSVar5 - (long)ppSVar2) >> 3));
  }
  if (ppSVar5 != ppSVar2) {
    (this->m_operationPrograms).
    super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppSVar2;
  }
  puVar3 = (this->m_operationResultStorages).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (this->m_operationResultStorages).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)puVar6 - (long)puVar3) >> 2)) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      if (*(int *)((long)puVar3 + lVar7) != 0) {
        iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
        (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))
                  (1,(long)(this->m_operationResultStorages).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar7);
      }
      lVar8 = lVar8 + 1;
      puVar3 = (this->m_operationResultStorages).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar6 = (this->m_operationResultStorages).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      lVar7 = lVar7 + 4;
    } while (lVar8 < (int)((ulong)((long)puVar6 - (long)puVar3) >> 2));
  }
  if (puVar6 != puVar3) {
    (this->m_operationResultStorages).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar3;
  }
  p_Var4 = (this->m_storageIDs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var4 == &(this->m_storageIDs)._M_t._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<int,_std::pair<const_int,_unsigned_int>,_std::_Select1st<std::pair<const_int,_unsigned_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
      ::clear(&(this->m_storageIDs)._M_t);
      return;
    }
    iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    if (this->m_storage == STORAGE_BUFFER) {
      lVar7 = 0x438;
LAB_0049b29e:
      (**(code **)(CONCAT44(extraout_var_00,iVar1) + lVar7))(1,&p_Var4[1].field_0x4);
    }
    else if (this->m_storage == STORAGE_IMAGE) {
      lVar7 = 0x480;
      goto LAB_0049b29e;
    }
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
  } while( true );
}

Assistant:

void InterCallTestCase::deinit (void)
{
	// programs
	for (int ndx = 0; ndx < (int)m_operationPrograms.size(); ++ndx)
		delete m_operationPrograms[ndx];
	m_operationPrograms.clear();

	// result storages
	for (int ndx = 0; ndx < (int)m_operationResultStorages.size(); ++ndx)
	{
		if (m_operationResultStorages[ndx])
			m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_operationResultStorages[ndx]);
	}
	m_operationResultStorages.clear();

	// storage
	for (std::map<int, glw::GLuint>::const_iterator it = m_storageIDs.begin(); it != m_storageIDs.end(); ++it)
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		if (m_storage == STORAGE_BUFFER)
			gl.deleteBuffers(1, &it->second);
		else if (m_storage == STORAGE_IMAGE)
			gl.deleteTextures(1, &it->second);
		else
			DE_ASSERT(DE_FALSE);
	}
	m_storageIDs.clear();
}